

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_statement.cpp
# Opt level: O1

void __thiscall
duckdb::SetVariableStatement::SetVariableStatement
          (SetVariableStatement *this,SetVariableStatement *other)

{
  pointer pcVar1;
  pointer pPVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  string local_38;
  
  pcVar1 = (other->super_SetStatement).name._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (other->super_SetStatement).name._M_string_length);
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&other->value);
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_40,pPVar2);
  SetVariableStatement
            (this,&local_38,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_40,(other->super_SetStatement).scope);
  if (local_40._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_40._M_head_impl = (ParsedExpression *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

SetVariableStatement::SetVariableStatement(const SetVariableStatement &other)
    : SetVariableStatement(other.name, other.value->Copy(), other.scope) {
}